

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluCheckDecIn(word t,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  int Cof4 [4];
  int Cof2 [2];
  int u;
  int v;
  int nVars_local;
  word t_local;
  
  Cof2[1] = 0;
  do {
    if (0 < Cof2[1]) {
      return 0;
    }
    wVar5 = Abc_Tt6Cofactor0(t,Cof2[1]);
    wVar6 = Abc_Tt6Cofactor1(t,Cof2[1]);
    Cof2[0] = Cof2[1];
    while (Cof2[0] = Cof2[0] + 1, Cof2[0] < nVars) {
      wVar7 = Abc_Tt6Cofactor0((long)(int)wVar5,Cof2[0]);
      iVar1 = (int)wVar7;
      wVar7 = Abc_Tt6Cofactor1((long)(int)wVar5,Cof2[0]);
      iVar2 = (int)wVar7;
      wVar7 = Abc_Tt6Cofactor0((long)(int)wVar6,Cof2[0]);
      iVar3 = (int)wVar7;
      wVar7 = Abc_Tt6Cofactor1((long)(int)wVar6,Cof2[0]);
      iVar4 = (int)wVar7;
      if ((iVar1 == iVar2) && (iVar1 == iVar3)) {
        return 1;
      }
      if ((iVar1 == iVar3) && (iVar1 == iVar4)) {
        return 1;
      }
      if ((iVar1 == iVar2) && (iVar1 == iVar4)) {
        return 1;
      }
      if ((iVar2 == iVar3) && (iVar2 == iVar4)) {
        return 1;
      }
    }
    Cof2[1] = Cof2[1] + 1;
  } while( true );
}

Assistant:

int If_CluCheckDecIn( word t, int nVars )
{
    int v, u, Cof2[2], Cof4[4];
//    for ( v = 0; v < nVars; v++ )
    for ( v = 0; v < 1; v++ ) // restrict to the first (decomposed) input
    {
        Cof2[0] = Abc_Tt6Cofactor0( t, v );
        Cof2[1] = Abc_Tt6Cofactor1( t, v );
        for ( u = v+1; u < nVars; u++ )
        {
            Cof4[0] = Abc_Tt6Cofactor0( Cof2[0], u );
            Cof4[1] = Abc_Tt6Cofactor1( Cof2[0], u );
            Cof4[2] = Abc_Tt6Cofactor0( Cof2[1], u );
            Cof4[3] = Abc_Tt6Cofactor1( Cof2[1], u );
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[2] )
                return 1;
            if ( Cof4[0] == Cof4[2] && Cof4[0] == Cof4[3] )
                return 1;
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[3] )
                return 1;
            if ( Cof4[1] == Cof4[2] && Cof4[1] == Cof4[3] )
                return 1;
        }
    }
    return 0;
}